

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O3

void c352_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  size_t __n;
  char cVar2;
  byte bVar3;
  undefined2 uVar4;
  uint uVar5;
  uint uVar6;
  DEV_SMPL *pDVar7;
  DEV_SMPL *pDVar8;
  short sVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  
  __n = (ulong)samples * 4;
  uVar23 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0) {
    cVar2 = *(char *)((long)chip + 0x4a0);
    do {
      iVar14 = 0;
      lVar16 = 0x2c;
      iVar15 = 0;
      iVar11 = 0;
      iVar12 = 0;
      do {
        uVar10 = *(ushort *)((long)chip + lVar16 + -10);
        uVar18 = (uint)uVar10;
        if ((short)uVar10 < 0) {
          uVar5 = *(uint *)((long)chip + lVar16 + -0x1c);
          uVar20 = *(ushort *)((long)chip + lVar16 + -0xc) + uVar5;
          if ((uVar20 >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)chip + lVar16 + -0x16) =
                 *(undefined2 *)((long)chip + lVar16 + -0x18);
            if ((uVar10 & 0x10) == 0) {
              uVar6 = *(uint *)((long)chip + lVar16 + -0x20);
              bVar3 = *(byte *)(*(long *)((long)chip + 0x490) +
                               (ulong)(*(uint *)((long)chip + 0x49c) & uVar6));
              if ((uVar10 & 8) == 0) {
                sVar9 = (ushort)bVar3 << 8;
              }
              else {
                sVar9 = *(short *)((long)chip + (ulong)bVar3 * 2 + 0x4a2);
              }
              *(short *)((long)chip + lVar16 + -0x18) = sVar9;
              uVar17 = (uint)uVar10;
              sVar9 = (short)uVar6;
              if ((~uVar10 & 3) == 0) {
                if (((uVar10 & 0x40) == 0) || (*(short *)((long)chip + lVar16 + -2) != sVar9)) {
                  uVar24 = 0xffffffff;
                  if (((uVar10 & 0x40) == 0) &&
                     (uVar24 = 1, *(short *)((long)chip + lVar16 + -4) == sVar9)) {
                    uVar18 = uVar17 | 0x40;
                    goto LAB_00171b41;
                  }
                }
                else {
                  uVar18 = uVar17 & 0xffbf;
LAB_00171b41:
                  *(short *)((long)chip + lVar16 + -10) = (short)uVar18;
                  uVar24 = -(uVar18 >> 6 & 1) | 1;
                }
                *(uint *)((long)chip + lVar16 + -0x20) = uVar24 + uVar6;
              }
              else if (*(short *)((long)chip + lVar16 + -4) == sVar9) {
                if ((~uVar10 & 0x22) == 0) {
                  *(uint *)((long)chip + lVar16 + -0x20) =
                       CONCAT22(*(undefined2 *)((long)chip + lVar16 + -6),
                                *(undefined2 *)((long)chip + lVar16 + -2));
                }
                else {
                  if ((uVar10 & 2) == 0) {
                    uVar18 = uVar17 & 0x5ffd | 0x2000;
                    *(short *)((long)chip + lVar16 + -10) = (short)uVar18;
                    *(undefined2 *)((long)chip + lVar16 + -0x18) = 0;
                    goto LAB_00171bbb;
                  }
                  *(uint *)((long)chip + lVar16 + -0x20) =
                       (uint)*(ushort *)((long)chip + lVar16 + -2) | uVar6 & 0xff0000;
                }
                uVar18 = uVar17 | 0x800;
                *(short *)((long)chip + lVar16 + -10) = (short)uVar18;
              }
              else {
                *(uint *)((long)chip + lVar16 + -0x20) = uVar6 + (-(uVar17 & 1) | 1);
              }
            }
            else {
              uVar10 = -(*(ushort *)((long)chip + 0x48c) & 1) & 0xfff6 ^
                       *(ushort *)((long)chip + 0x48c) >> 1;
              *(ushort *)((long)chip + 0x48c) = uVar10;
              *(ushort *)((long)chip + lVar16 + -0x18) = uVar10;
            }
          }
LAB_00171bbb:
          if (((uVar5 ^ uVar20) & 0x18000) != 0) {
            uVar4 = *(undefined2 *)((long)chip + lVar16 + -0x14);
            bVar3 = *(byte *)((long)chip + lVar16 + -0x10);
            bVar13 = (byte)((ushort)uVar4 >> 8);
            if (bVar3 != bVar13) {
              *(byte *)((long)chip + lVar16 + -0x10) = (-(bVar13 < bVar3) | 1U) + bVar3;
            }
            bVar3 = *(byte *)((long)chip + lVar16 + -0xf);
            bVar13 = (byte)uVar4;
            if (bVar3 != bVar13) {
              *(byte *)((long)chip + lVar16 + -0xf) = (-(bVar13 < bVar3) | 1U) + bVar3;
            }
            uVar4 = *(undefined2 *)((long)chip + lVar16 + -0x12);
            bVar3 = *(byte *)((long)chip + lVar16 + -0xe);
            bVar13 = (byte)((ushort)uVar4 >> 8);
            if (bVar3 != bVar13) {
              *(byte *)((long)chip + lVar16 + -0xe) = (-(bVar13 < bVar3) | 1U) + bVar3;
            }
            bVar3 = *(byte *)((long)chip + lVar16 + -0xd);
            bVar13 = (byte)uVar4;
            if (bVar3 != bVar13) {
              *(byte *)((long)chip + lVar16 + -0xd) = (-(bVar13 < bVar3) | 1U) + bVar3;
            }
          }
          *(uint *)((long)chip + lVar16 + -0x1c) = uVar20 & 0xffff;
          if ((uVar18 & 4) == 0) {
            sVar9 = *(short *)((long)chip + lVar16 + -0x16);
            iVar21 = (int)(((long)*(short *)((long)chip + lVar16 + -0x18) - (long)sVar9) *
                           (ulong)(uVar20 & 0xffff) >> 0x10) + (int)sVar9;
          }
          else {
            iVar21 = (int)*(short *)((long)chip + lVar16 + -0x18);
          }
        }
        else {
          iVar21 = 0;
        }
        if (*(char *)((long)chip + lVar16) == '\0') {
          iVar19 = -iVar21;
          iVar22 = iVar19;
          if ((uVar18 >> 8 & 1) == 0) {
            iVar22 = iVar21;
          }
          iVar14 = iVar14 + ((int)((uint)*(byte *)((long)chip + lVar16 + -0x10) * iVar22) >> 8);
          iVar22 = iVar19;
          if ((uVar18 >> 9 & 1) == 0) {
            iVar22 = iVar21;
          }
          iVar11 = iVar11 + ((int)((uint)*(byte *)((long)chip + lVar16 + -0xe) * iVar22) >> 8);
          if (-1 < (char)uVar18) {
            iVar19 = iVar21;
          }
          iVar15 = iVar15 + ((int)((uint)*(byte *)((long)chip + lVar16 + -0xf) * iVar19) >> 8);
          iVar12 = iVar12 + ((int)((uint)*(byte *)((long)chip + lVar16 + -0xd) * iVar19) >> 8);
        }
        lVar16 = lVar16 + 0x24;
      } while (lVar16 != 0x4ac);
      pDVar7 = *outputs;
      piVar1 = pDVar7 + uVar23;
      *piVar1 = *piVar1 + iVar14;
      pDVar8 = outputs[1];
      piVar1 = pDVar8 + uVar23;
      *piVar1 = *piVar1 + iVar15;
      if ((cVar2 == '\0') && (*(char *)((long)chip + 0x4a1) == '\0')) {
        piVar1 = pDVar7 + uVar23;
        *piVar1 = *piVar1 + iVar11;
        piVar1 = pDVar8 + uVar23;
        *piVar1 = *piVar1 + iVar12;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != samples);
  }
  return;
}

Assistant:

static void c352_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	C352 *c = (C352 *)chip;
	UINT32 i, j;
	INT32 s;
	INT32 next_counter;
	C352_Voice* v;

	DEV_SMPL out[4];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	for(i=0;i<samples;i++)
	{
		out[0]=out[1]=out[2]=out[3]=0;

		for(j=0;j<C352_VOICES;j++)
		{

			v = &c->v[j];
			s = 0;

			if(v->flags & C352_FLG_BUSY)
			{
				next_counter = v->counter+v->freq;

				if(next_counter & 0x10000)
				{
					C352_fetch_sample(c,v);
				}

				if((next_counter^v->counter) & 0x18000)
				{
					c352_ramp_volume(v,0,v->vol_f>>8);
					c352_ramp_volume(v,1,v->vol_f&0xff);
					c352_ramp_volume(v,2,v->vol_r>>8);
					c352_ramp_volume(v,3,v->vol_r&0xff);
				}

				v->counter = next_counter&0xffff;

				// Interpolate samples
				if((v->flags & C352_FLG_FILTER) == 0)
					s = v->last_sample + (INT32)((INT64)v->counter*(v->sample-v->last_sample)>>16);
				else
					s = v->sample;
			}

			if(!c->v[j].mute)
			{
				// Left
				out[0] += (((v->flags & C352_FLG_PHASEFL) ? -s : s) * v->curr_vol[0])>>8;
				out[2] += (((v->flags & C352_FLG_PHASERL) ? -s : s) * v->curr_vol[2])>>8;

				// Right
				out[1] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[1])>>8;
				out[3] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[3])>>8;
			}
		}

		outputs[0][i] += out[0];
		outputs[1][i] += out[1];
		if (!c->muteRear && !c->optMuteRear)
		{
			outputs[0][i] += out[2];
			outputs[1][i] += out[3];
		}
	}
}